

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O0

void filter_4x2_sse4_1(uint8_t *dst,ptrdiff_t stride,__m128i *pixels,__m128i *taps_0_1,
                      __m128i *taps_2_3,__m128i *taps_4_5,__m128i *taps_6_7)

{
  undefined1 (*in_RCX) [16];
  int bits;
  undefined1 (*in_RDX) [16];
  long in_RSI;
  long lVar1;
  void *in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i v;
  __m128i v_val_d;
  __m128i v_val_d_00;
  __m128i output_row1;
  __m128i mul_1_23;
  __m128i mul_1_01;
  __m128i output_row0;
  __m128i output;
  __m128i output_half;
  __m128i mul_0_23;
  __m128i mul_0_01;
  
  auVar2 = pmaddubsw(*in_RDX,*in_RCX);
  auVar3 = pmaddubsw(*in_RDX,*in_R8);
  auVar2 = phaddw(auVar2,auVar3);
  phaddw(auVar2,auVar2);
  v_val_d[1] = in_RSI;
  v_val_d[0] = 4;
  lVar1 = in_RSI;
  alVar4 = xx_roundn_epi16_unsigned(v_val_d,(int)in_RDX);
  alVar4[0] = lVar1;
  xx_storel_32(in_RDI,alVar4);
  auVar2 = pmaddubsw(*in_RDX,*in_R9);
  auVar3 = pmaddubsw(*in_RDX,*(undefined1 (*) [16])output_row1[1]);
  auVar2 = phaddw(auVar2,auVar3);
  phaddw(auVar2,auVar2);
  v_val_d_00[1] = lVar1;
  v_val_d_00[0] = 4;
  alVar4 = xx_roundn_epi16_unsigned(v_val_d_00,bits);
  v[1] = alVar4[1];
  v[0] = lVar1;
  xx_storel_32((void *)((long)in_RDI + in_RSI),v);
  return;
}

Assistant:

static inline void filter_4x2_sse4_1(uint8_t *dst, const ptrdiff_t stride,
                                     const __m128i *pixels,
                                     const __m128i *taps_0_1,
                                     const __m128i *taps_2_3,
                                     const __m128i *taps_4_5,
                                     const __m128i *taps_6_7) {
  const __m128i mul_0_01 = _mm_maddubs_epi16(*pixels, *taps_0_1);
  const __m128i mul_0_23 = _mm_maddubs_epi16(*pixels, *taps_2_3);
  // |output_half| contains 8 partial sums.
  __m128i output_half = _mm_hadd_epi16(mul_0_01, mul_0_23);
  __m128i output = _mm_hadd_epi16(output_half, output_half);
  const __m128i output_row0 =
      _mm_packus_epi16(xx_roundn_epi16_unsigned(output, 4),
                       /* arbitrary pack arg */ output);
  xx_storel_32(dst, output_row0);
  const __m128i mul_1_01 = _mm_maddubs_epi16(*pixels, *taps_4_5);
  const __m128i mul_1_23 = _mm_maddubs_epi16(*pixels, *taps_6_7);
  output_half = _mm_hadd_epi16(mul_1_01, mul_1_23);
  output = _mm_hadd_epi16(output_half, output_half);
  const __m128i output_row1 =
      _mm_packus_epi16(xx_roundn_epi16_unsigned(output, 4),
                       /* arbitrary pack arg */ output);
  xx_storel_32(dst + stride, output_row1);
}